

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O3

int linear_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double local_50;
  undefined8 uStack_30;
  
  lVar9 = data->input_frames;
  if (0 < lVar9) {
    pvVar3 = psrc->private_data;
    if (pvVar3 == (void *)0x0) {
      return 5;
    }
    uVar10 = *(uint *)((long)pvVar3 + 4);
    if (*(int *)((long)pvVar3 + 8) != 0) {
      if (0 < (int)uVar10) {
        pfVar4 = data->data_in;
        uVar11 = 0;
        do {
          *(float *)((long)pvVar3 + uVar11 * 4 + 0x30) = pfVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      *(undefined4 *)((long)pvVar3 + 8) = 0;
    }
    lVar9 = lVar9 * (int)uVar10;
    *(long *)((long)pvVar3 + 0x10) = lVar9;
    lVar8 = (long)(int)uVar10 * data->output_frames;
    *(long *)((long)pvVar3 + 0x20) = lVar8;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    *(undefined8 *)((long)pvVar3 + 0x18) = 0;
    dVar12 = psrc->last_ratio;
    if (dVar12 < 0.00390625) {
      return 0x16;
    }
    if (256.0 < dVar12) {
      return 0x16;
    }
    dVar14 = psrc->last_position;
    local_50 = dVar12;
    if (dVar14 < 1.0) {
      lVar7 = 0;
      do {
        if ((lVar8 <= lVar7) || ((double)lVar9 <= (dVar14 + 1.0) * (double)(int)uVar10 + 0.0))
        break;
        if ((0 < lVar8) && (1e-20 < ABS(dVar12 - data->src_ratio))) {
          local_50 = ((data->src_ratio - dVar12) * (double)lVar7) / (double)lVar8 + dVar12;
        }
        if (0 < (int)uVar10) {
          pfVar4 = data->data_in;
          pfVar5 = data->data_out;
          uVar11 = 0;
          do {
            fVar1 = *(float *)((long)pvVar3 + uVar11 * 4 + 0x30);
            pfVar5[lVar7 + uVar11] =
                 (float)((double)(pfVar4[uVar11] - fVar1) * dVar14 + (double)fVar1);
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
          lVar7 = lVar7 + uVar11;
          *(long *)((long)pvVar3 + 0x28) = lVar7;
        }
        dVar14 = dVar14 + 1.0 / local_50;
      } while (dVar14 < 1.0);
    }
    lVar9 = lrint(dVar14);
    dVar12 = dVar14 - (double)lVar9;
    dVar12 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar12 |
                     (ulong)(dVar12 + 1.0) & -(ulong)(dVar12 < 0.0));
    iVar2 = *(int *)((long)pvVar3 + 4);
    lVar9 = lrint(dVar14 - dVar12);
    lVar7 = lVar9 * iVar2 + *(long *)((long)pvVar3 + 0x18);
    *(long *)((long)pvVar3 + 0x18) = lVar7;
    lVar9 = *(long *)((long)pvVar3 + 0x20);
    lVar8 = *(long *)((long)pvVar3 + 0x28);
    if (lVar8 < lVar9) {
      uStack_30 = 0;
      do {
        uVar10 = *(uint *)((long)pvVar3 + 4);
        if ((double)*(long *)((long)pvVar3 + 0x10) <= (double)(int)uVar10 * dVar12 + (double)lVar7)
        break;
        if (0 < lVar9) {
          dVar14 = psrc->last_ratio;
          if (1e-20 < ABS(dVar14 - data->src_ratio)) {
            local_50 = ((data->src_ratio - dVar14) * (double)lVar8) / (double)lVar9 + dVar14;
          }
        }
        if (0 < (int)uVar10) {
          pfVar4 = data->data_in;
          pfVar5 = data->data_out;
          uVar11 = 0;
          do {
            fVar1 = pfVar4[(lVar7 - (ulong)uVar10) + uVar11];
            pfVar5[lVar8 + uVar11] =
                 (float)((double)(pfVar4[lVar7 + uVar11] - fVar1) * dVar12 + (double)fVar1);
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
          *(ulong *)((long)pvVar3 + 0x28) = lVar8 + uVar11;
        }
        dVar14 = dVar12 + 1.0 / local_50;
        lVar9 = lrint(dVar14);
        dVar12 = dVar14 - (double)lVar9;
        auVar13._0_8_ = ~-(ulong)(dVar12 < 0.0) & (ulong)dVar12;
        auVar13._8_8_ = 0;
        auVar6._8_4_ = (int)uStack_30;
        auVar6._0_8_ = (ulong)(dVar12 + 1.0) & -(ulong)(dVar12 < 0.0);
        auVar6._12_4_ = (int)((ulong)uStack_30 >> 0x20);
        iVar2 = *(int *)((long)pvVar3 + 4);
        dVar12 = SUB168(auVar13 | auVar6,0);
        lVar9 = lrint(dVar14 - dVar12);
        uStack_30 = SUB168(auVar13 | auVar6,8);
        lVar7 = lVar9 * iVar2 + *(long *)((long)pvVar3 + 0x18);
        *(long *)((long)pvVar3 + 0x18) = lVar7;
        lVar9 = *(long *)((long)pvVar3 + 0x20);
        lVar8 = *(long *)((long)pvVar3 + 0x28);
      } while (lVar8 < lVar9);
    }
    lVar9 = *(long *)((long)pvVar3 + 0x10);
    if (lVar7 - lVar9 == 0 || lVar7 < lVar9) {
      uVar10 = *(uint *)((long)pvVar3 + 4);
    }
    else {
      uVar10 = *(uint *)((long)pvVar3 + 4);
      dVar12 = dVar12 + (double)((lVar7 - lVar9) / (long)(int)uVar10);
      *(long *)((long)pvVar3 + 0x18) = lVar9;
      lVar7 = lVar9;
    }
    psrc->last_position = dVar12;
    if ((0 < lVar7) && (0 < (int)uVar10)) {
      pfVar4 = data->data_in;
      uVar11 = 0;
      do {
        *(float *)((long)pvVar3 + uVar11 * 4 + 0x30) = pfVar4[(lVar7 - (ulong)uVar10) + uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    psrc->last_ratio = local_50;
    data->input_frames_used = lVar7 / (long)(int)uVar10;
    data->output_frames_gen = lVar8 / (long)(int)uVar10;
  }
  return 0;
}

Assistant:

static int
linear_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	LINEAR_DATA *priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (LINEAR_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * (1.0 + input_index) >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (priv->last_value [ch] + input_index *
										(data->data_in [ch] - priv->last_value [ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index < priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		if (SRC_DEBUG && priv->in_used < priv->channels && input_index < 1.0)
		{	printf ("Whoops!!!!   in_used : %ld     channels : %d     input_index : %f\n", priv->in_used, priv->channels, input_index) ;
			exit (1) ;
			} ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (data->data_in [priv->in_used - priv->channels + ch] + input_index *
						(data->data_in [priv->in_used + ch] - data->data_in [priv->in_used - priv->channels + ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}